

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infback.c
# Opt level: O2

int inflateBack(z_streamp strm,in_func in,void *in_desc,out_func out,void *out_desc)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uchar *puVar4;
  void *pvVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  undefined2 uVar11;
  ushort *puVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulg uVar17;
  uint uVar18;
  ulong uVar19;
  byte bVar20;
  Posf *pPVar21;
  uchar uVar22;
  ulong uVar23;
  ulong uVar24;
  out_func p_Var25;
  z_streamp pzVar26;
  internal_state *piVar27;
  bool bVar28;
  uchar *next;
  uint local_ac;
  out_func local_a8;
  in_func local_a0;
  z_streamp local_98;
  int local_8c;
  uchar *local_88;
  void *local_80;
  long *local_78;
  internal_state *local_70;
  void *local_68;
  ulong local_60;
  ct_data_s *local_58;
  uInt *local_50;
  Posf **local_48;
  ct_data_s *local_40;
  uint *local_38;
  
  if ((strm == (z_streamp)0x0) || (piVar27 = strm->state, piVar27 == (internal_state *)0x0)) {
    return -2;
  }
  strm->msg = (char *)0x0;
  *(undefined8 *)&piVar27->status = 0x3f3f;
  *(undefined4 *)&piVar27->gzindex = 0;
  next = strm->next_in;
  uVar6 = 0;
  if (next != (Bytef *)0x0) {
    uVar6 = strm->avail_in;
  }
  local_88 = *(uchar **)&piVar27->method;
  local_ac = *(uint *)((long)&piVar27->gzhead + 4);
  local_78 = &piVar27->block_start;
  local_40 = piVar27->dyn_ltree + 0x121;
  local_50 = &piVar27->hash_shift;
  local_48 = &piVar27->head;
  local_58 = piVar27->dyn_ltree + 0x91;
  local_38 = (uint *)((long)&piVar27->head + 4);
  iVar8 = 0x3f3f;
  local_8c = -5;
  uVar24 = 0;
  uVar19 = 0;
  local_a8 = out;
  local_a0 = in;
  local_98 = strm;
  local_80 = in_desc;
  local_70 = piVar27;
  local_68 = out_desc;
  do {
    pvVar5 = local_80;
    pzVar26 = local_98;
    bVar28 = false;
    uVar14 = (uint)uVar19;
    uVar7 = local_ac;
    switch(iVar8) {
    case 0x3f3f:
      if (*(int *)&piVar27->field_0xc == 0) {
        while ((uint)uVar19 < 3) {
          if ((uVar6 == 0) && (uVar6 = (*local_a0)(pvVar5,&next), uVar6 == 0)) goto LAB_00150df8;
          uVar6 = uVar6 - 1;
          uVar24 = uVar24 + ((ulong)*next << ((byte)uVar19 & 0x3f));
          next = next + 1;
          uVar19 = (ulong)(uVar14 | 8);
        }
        *(uint *)&piVar27->field_0xc = (uint)uVar24 & 1;
        switch((uint)(uVar24 >> 1) & 3) {
        case 0:
          iVar8 = 0x3f41;
          break;
        case 1:
          piVar27->window_size = (ulg)fixedtables_lenfix;
          piVar27->head = (Posf *)0x500000009;
          piVar27->prev = (Posf *)fixedtables_distfix;
          iVar8 = 0x3f48;
          break;
        case 2:
          iVar8 = 0x3f44;
          break;
        case 3:
          local_98->msg = "invalid block type";
          iVar8 = 0x3f51;
        }
        piVar27->status = iVar8;
        uVar24 = uVar24 >> 3;
        uVar19 = (ulong)((uint)uVar19 - 3);
        uVar7 = local_ac;
      }
      else {
        uVar24 = uVar24 >> ((byte)uVar19 & 7);
        uVar19 = (ulong)(uVar14 & 0xfffffff8);
        piVar27->status = 0x3f50;
      }
      break;
    case 0x3f40:
    case 0x3f42:
    case 0x3f43:
    case 0x3f45:
    case 0x3f46:
    case 0x3f47:
      local_8c = -2;
LAB_00150e03:
      bVar28 = false;
      p_Var25 = local_a8;
      uVar7 = local_ac;
LAB_00150e0c:
      uVar14 = *(uint *)((long)&piVar27->gzhead + 4);
      uVar15 = uVar14 - uVar7;
      if (uVar7 <= uVar14 && uVar15 != 0) {
        iVar9 = (*p_Var25)(local_68,*(uchar **)&piVar27->method,uVar15);
        iVar8 = -5;
        if (iVar9 == 0) {
          iVar8 = local_8c;
        }
        if (bVar28) {
          local_8c = iVar8;
        }
      }
      local_98->next_in = next;
      local_98->avail_in = uVar6;
      return local_8c;
    case 0x3f41:
      uVar24 = uVar24 >> ((byte)uVar19 & 7);
      for (uVar19 = (ulong)(uVar14 & 0xfffffff8); p_Var25 = local_a8, uVar19 < 0x20;
          uVar19 = uVar19 + 8) {
        if ((uVar6 == 0) && (uVar6 = (*local_a0)(pvVar5,&next), uVar6 == 0)) goto LAB_00150df8;
        uVar6 = uVar6 - 1;
        uVar24 = uVar24 + ((ulong)*next << ((byte)uVar19 & 0x3f));
        next = next + 1;
      }
      if ((uVar24 >> 0x10 ^ uVar24 & 0xffff) != 0xffff) {
        pcVar10 = "invalid stored block lengths";
        goto LAB_001503fd;
      }
      uVar24 = uVar24 & 0xffff;
      uVar7 = local_ac;
      while( true ) {
        uVar14 = (uint)uVar24;
        *(uint *)&piVar27->field_0x5c = uVar14;
        if (uVar14 == 0) break;
        if ((uVar6 == 0) && (uVar6 = (*local_a0)(local_80,&next), uVar6 == 0)) {
          next = (uchar *)0x0;
          uVar6 = 0;
          goto LAB_00150e82;
        }
        if (uVar7 == 0) {
          local_88 = *(uchar **)&piVar27->method;
          uVar7 = *(uint *)((long)&piVar27->gzhead + 4);
          *(uint *)&piVar27->gzindex = uVar7;
          iVar8 = (*p_Var25)(local_68);
          if (iVar8 != 0) goto LAB_00150e82;
        }
        puVar4 = local_88;
        if (uVar6 <= uVar14) {
          uVar14 = uVar6;
        }
        if (uVar7 <= uVar14) {
          uVar14 = uVar7;
        }
        uVar24 = (ulong)uVar14;
        memcpy(local_88,next,uVar24);
        uVar6 = uVar6 - uVar14;
        next = next + uVar24;
        uVar7 = uVar7 - uVar14;
        local_88 = puVar4 + uVar24;
        uVar24 = (ulong)(*(int *)&piVar27->field_0x5c - uVar14);
      }
      piVar27->status = 0x3f3f;
      uVar24 = 0;
      uVar19 = 0;
      break;
    case 0x3f44:
      for (uVar19 = uVar19 & 0xffffffff; uVar19 < 0xe; uVar19 = uVar19 + 8) {
        if ((uVar6 == 0) && (uVar6 = (*local_a0)(pvVar5,&next), uVar6 == 0)) goto LAB_00150df8;
        uVar6 = uVar6 - 1;
        uVar24 = uVar24 + ((ulong)*next << ((byte)uVar19 & 0x3f));
        next = next + 1;
      }
      uVar14 = (uint)uVar24 & 0x1f;
      piVar27->hash_size = uVar14 + 0x101;
      uVar15 = (uint)(uVar24 >> 5) & 0x1f;
      piVar27->hash_bits = uVar15 + 1;
      uVar7 = ((uint)(uVar24 >> 10) & 0xf) + 4;
      piVar27->ins_h = uVar7;
      uVar24 = uVar24 >> 0xe;
      uVar19 = uVar19 - 0xe;
      if (uVar14 < 0x1e && uVar15 < 0x1e) {
        piVar27->hash_mask = 0;
        uVar14 = 0;
        while (uVar14 < uVar7) {
          uVar7 = (uint)uVar19;
          while ((uint)uVar19 < 3) {
            if ((uVar6 == 0) && (uVar6 = (*local_a0)(pvVar5,&next), uVar6 == 0)) goto LAB_00150df8;
            uVar6 = uVar6 - 1;
            uVar24 = uVar24 + ((ulong)*next << ((byte)uVar19 & 0x3f));
            next = next + 1;
            uVar19 = (ulong)(uVar7 | 8);
          }
          uVar7 = piVar27->hash_mask;
          uVar14 = uVar7 + 1;
          piVar27->hash_mask = uVar14;
          *(ushort *)((long)(piVar27->dyn_ltree + -0xf) + (ulong)inflateBack::order[uVar7] * 2) =
               (ushort)uVar24 & 7;
          uVar24 = uVar24 >> 3;
          uVar19 = (ulong)((uint)uVar19 - 3);
          uVar7 = piVar27->ins_h;
        }
        puVar12 = inflateBack::order + uVar14;
        while (uVar14 < 0x13) {
          uVar14 = uVar14 + 1;
          piVar27->hash_mask = uVar14;
          *(undefined2 *)((long)(piVar27->dyn_ltree + -0xf) + (ulong)*puVar12 * 2) = 0;
          puVar12 = puVar12 + 1;
        }
        *(ct_data_s **)&piVar27->hash_shift = local_40;
        piVar27->window_size = (ulg)local_40;
        *(undefined4 *)&piVar27->head = 7;
        iVar8 = inflate_table(CODES,(unsigned_short *)local_78,0x13,(code **)local_50,
                              (uint *)local_48,(unsigned_short *)local_58);
        if (iVar8 != 0) {
          pcVar10 = "invalid code lengths set";
          pzVar26 = local_98;
          goto LAB_001503fd;
        }
        piVar27->hash_mask = 0;
        uVar7 = 0;
        while (pzVar26 = local_98, uVar7 < piVar27->hash_bits + piVar27->hash_size) {
          uVar23 = uVar19 & 0xffffffff;
          while( true ) {
            uVar16 = (ulong)(~(-1 << (*(byte *)&piVar27->head & 0x1f)) & (uint)uVar24);
            bVar1 = *(byte *)(piVar27->window_size + 1 + uVar16 * 4);
            uVar13 = (ulong)bVar1;
            if (uVar13 <= uVar23) break;
            if ((uVar6 == 0) && (uVar6 = (*local_a0)(pvVar5,&next), uVar6 == 0)) goto LAB_00150df8;
            uVar6 = uVar6 - 1;
            uVar24 = uVar24 + ((ulong)*next << ((byte)uVar23 & 0x3f));
            uVar23 = uVar23 + 8;
            uVar19 = (ulong)((int)uVar19 + 8);
            next = next + 1;
          }
          uVar3 = *(ushort *)(piVar27->window_size + 2 + uVar16 * 4);
          if (uVar3 < 0x10) {
            uVar24 = uVar24 >> (bVar1 & 0x3f);
            uVar19 = (ulong)((int)uVar23 - (uint)bVar1);
            uVar14 = piVar27->hash_mask;
            uVar7 = uVar14 + 1;
            piVar27->hash_mask = uVar7;
            *(ushort *)((long)(piVar27->dyn_ltree + -0xf) + (ulong)uVar14 * 2) = uVar3;
          }
          else {
            if (uVar3 == 0x10) {
              uVar7 = (int)uVar19 - (uint)bVar1;
              local_60 = uVar13;
              for (; uVar19 = (ulong)uVar7, uVar23 < uVar13 + 2; uVar23 = uVar23 + 8) {
                if ((uVar6 == 0) && (uVar6 = (*local_a0)(pvVar5,&next), uVar6 == 0))
                goto LAB_00150df8;
                uVar6 = uVar6 - 1;
                uVar24 = uVar24 + ((ulong)*next << ((byte)uVar23 & 0x3f));
                uVar7 = uVar7 + 8;
                next = next + 1;
              }
              uVar24 = uVar24 >> ((byte)local_60 & 0x3f);
              if (piVar27->hash_mask == 0) {
                pcVar10 = "invalid bit length repeat";
                pzVar26 = local_98;
                goto LAB_001503fd;
              }
              uVar11 = *(undefined2 *)((long)local_78 + (ulong)(piVar27->hash_mask - 1) * 2);
              iVar8 = ((uint)uVar24 & 3) + 3;
              uVar24 = uVar24 >> 2;
              uVar7 = ((int)uVar23 - (int)local_60) - 2;
            }
            else {
              if (uVar3 == 0x11) {
                for (; uVar23 < uVar13 + 3; uVar23 = uVar23 + 8) {
                  if ((uVar6 == 0) && (uVar6 = (*local_a0)(pvVar5,&next), uVar6 == 0))
                  goto LAB_00150df8;
                  uVar6 = uVar6 - 1;
                  uVar24 = uVar24 + ((ulong)*next << ((byte)uVar23 & 0x3f));
                  next = next + 1;
                }
                uVar24 = uVar24 >> (bVar1 & 0x3f);
                iVar8 = ((uint)uVar24 & 7) + 3;
                uVar24 = uVar24 >> 3;
                uVar7 = ((int)uVar23 - (uint)bVar1) - 3;
              }
              else {
                for (; uVar23 < uVar13 + 7; uVar23 = uVar23 + 8) {
                  if ((uVar6 == 0) && (uVar6 = (*local_a0)(pvVar5,&next), uVar6 == 0))
                  goto LAB_00150df8;
                  uVar6 = uVar6 - 1;
                  uVar24 = uVar24 + ((ulong)*next << ((byte)uVar23 & 0x3f));
                  next = next + 1;
                }
                uVar24 = uVar24 >> (bVar1 & 0x3f);
                iVar8 = ((uint)uVar24 & 0x7f) + 0xb;
                uVar24 = uVar24 >> 7;
                uVar7 = ((int)uVar23 - (uint)bVar1) - 7;
              }
              uVar11 = 0;
            }
            uVar19 = (ulong)uVar7;
            uVar7 = piVar27->hash_mask;
            if (piVar27->hash_bits + piVar27->hash_size < uVar7 + iVar8) {
              pcVar10 = "invalid bit length repeat";
              pzVar26 = local_98;
              goto LAB_001503fd;
            }
            while (bVar28 = iVar8 != 0, iVar8 = iVar8 + -1, bVar28) {
              uVar23 = (ulong)uVar7;
              uVar7 = uVar7 + 1;
              *(undefined2 *)((long)local_78 + uVar23 * 2) = uVar11;
            }
            piVar27->hash_mask = uVar7;
          }
        }
        uVar7 = local_ac;
        if (piVar27->status == 0x3f51) break;
        if (piVar27->dyn_ltree[0x71].fc.freq == 0) {
          pcVar10 = "invalid code -- missing end-of-block";
          goto LAB_001503fd;
        }
        *(ct_data_s **)&piVar27->hash_shift = local_40;
        piVar27->window_size = (ulg)local_40;
        *(undefined4 *)&piVar27->head = 9;
        iVar8 = inflate_table(LENS,(unsigned_short *)local_78,piVar27->hash_size,(code **)local_50,
                              (uint *)local_48,(unsigned_short *)local_58);
        if (iVar8 != 0) {
          pcVar10 = "invalid literal/lengths set";
          goto LAB_001503fd;
        }
        piVar27->prev = *(Posf **)&piVar27->hash_shift;
        *(undefined4 *)((long)&piVar27->head + 4) = 6;
        iVar8 = inflate_table(DISTS,(unsigned_short *)
                                    ((long)local_78 + (ulong)piVar27->hash_size * 2),
                              piVar27->hash_bits,(code **)local_50,local_38,
                              (unsigned_short *)local_58);
        piVar27 = local_70;
        if (iVar8 == 0) {
          local_70->status = 0x3f48;
          goto switchD_001501c5_caseD_3f48;
        }
        local_98->msg = "invalid distances set";
      }
      else {
        pcVar10 = "too many length or distance symbols";
        pzVar26 = local_98;
LAB_001503fd:
        pzVar26->msg = pcVar10;
      }
      piVar27->status = 0x3f51;
      uVar7 = local_ac;
      break;
    case 0x3f48:
switchD_001501c5_caseD_3f48:
      pzVar26 = local_98;
      if ((uVar6 < 6) || (local_ac < 0x102)) {
        uVar19 = uVar19 & 0xffffffff;
        while( true ) {
          uVar17 = piVar27->window_size;
          uVar23 = (ulong)(~(-1 << (*(byte *)&piVar27->head & 0x1f)) & (uint)uVar24);
          bVar1 = *(byte *)(uVar17 + 1 + uVar23 * 4);
          if (bVar1 <= uVar19) break;
          if ((uVar6 == 0) && (uVar6 = (*local_a0)(local_80,&next), uVar6 == 0)) goto LAB_00150df8;
          uVar6 = uVar6 - 1;
          uVar24 = uVar24 + ((ulong)*next << ((byte)uVar19 & 0x3f));
          uVar19 = uVar19 + 8;
          next = next + 1;
        }
        uVar3 = *(ushort *)(uVar17 + 2 + uVar23 * 4);
        bVar20 = *(byte *)(uVar17 + uVar23 * 4);
        bVar2 = bVar1;
        if ((byte)(bVar20 - 1) < 0xf) {
          while( true ) {
            uVar23 = (ulong)((((uint)uVar24 & ~(-1 << (bVar20 + bVar1 & 0x1f))) >> (bVar1 & 0x1f)) +
                            (uint)uVar3);
            bVar2 = *(byte *)(uVar17 + 1 + uVar23 * 4);
            if ((uint)bVar2 + (uint)bVar1 <= uVar19) break;
            if (uVar6 == 0) {
              uVar6 = (*local_a0)(local_80,&next);
              piVar27 = local_70;
              if (uVar6 == 0) {
                next = (uchar *)0x0;
                uVar6 = 0;
                bVar28 = false;
                p_Var25 = local_a8;
                uVar7 = local_ac;
                goto LAB_00150e0c;
              }
              uVar17 = local_70->window_size;
            }
            uVar6 = uVar6 - 1;
            uVar24 = uVar24 + ((ulong)*next << ((byte)uVar19 & 0x3f));
            uVar19 = uVar19 + 8;
            next = next + 1;
          }
          uVar24 = uVar24 >> (bVar1 & 0x3f);
          uVar3 = *(ushort *)(uVar17 + 2 + uVar23 * 4);
          bVar20 = *(byte *)(uVar17 + uVar23 * 4);
          uVar19 = (ulong)((int)uVar19 - (uint)bVar1);
        }
        pvVar5 = local_80;
        uVar22 = (uchar)uVar3;
        uVar24 = uVar24 >> (bVar2 & 0x3f);
        uVar19 = (ulong)((int)uVar19 - (uint)bVar2);
        *(uint *)&piVar27->field_0x5c = (uint)uVar3;
        if (bVar20 == 0) {
          if (local_ac == 0) {
            local_88 = *(uchar **)&piVar27->method;
            local_ac = *(uint *)((long)&piVar27->gzhead + 4);
            *(uint *)&piVar27->gzindex = local_ac;
            iVar8 = (*local_a8)();
            if (iVar8 != 0) goto LAB_00150e03;
            uVar22 = (uchar)*(undefined4 *)&piVar27->field_0x5c;
          }
          *local_88 = uVar22;
          local_88 = local_88 + 1;
          piVar27->status = 0x3f48;
          uVar7 = local_ac - 1;
        }
        else {
          if ((bVar20 & 0x20) == 0) {
            if ((bVar20 & 0x40) == 0) {
              uVar7 = bVar20 & 0xf;
              *(uint *)((long)&piVar27->window + 4) = uVar7;
              uVar23 = uVar19;
              if ((bVar20 & 0xf) != 0) {
                while( true ) {
                  uVar14 = (uint)uVar23;
                  uVar19 = (ulong)(uVar14 - uVar7);
                  if (uVar7 <= uVar14) break;
                  if (uVar6 == 0) {
                    uVar6 = (*local_a0)(pvVar5,&next);
                    if (uVar6 == 0) goto LAB_00150df8;
                    uVar7 = *(uint *)((long)&piVar27->window + 4);
                  }
                  uVar6 = uVar6 - 1;
                  uVar24 = uVar24 + ((ulong)*next << ((byte)uVar23 & 0x3f));
                  uVar23 = (ulong)(uVar14 + 8);
                  next = next + 1;
                }
                *(uint *)&piVar27->field_0x5c =
                     *(int *)&piVar27->field_0x5c + (~(-1 << ((byte)uVar7 & 0x1f)) & (uint)uVar24);
                uVar24 = uVar24 >> ((byte)uVar7 & 0x3f);
              }
              while( true ) {
                pPVar21 = piVar27->prev;
                uVar23 = (ulong)(~(-1 << (*(byte *)((long)&piVar27->head + 4) & 0x1f)) &
                                (uint)uVar24);
                bVar1 = *(byte *)((long)pPVar21 + uVar23 * 4 + 1);
                if (bVar1 <= uVar19) break;
                if ((uVar6 == 0) && (uVar6 = (*local_a0)(local_80,&next), uVar6 == 0))
                goto LAB_00150df8;
                uVar6 = uVar6 - 1;
                uVar24 = uVar24 + ((ulong)*next << ((byte)uVar19 & 0x3f));
                uVar19 = uVar19 + 8;
                next = next + 1;
              }
              uVar3 = pPVar21[uVar23 * 2 + 1];
              bVar20 = (byte)pPVar21[uVar23 * 2];
              bVar2 = bVar1;
              if (bVar20 < 0x10) {
                uVar7 = ~(-1 << (bVar20 + bVar1 & 0x1f));
                local_60 = CONCAT44(local_60._4_4_,uVar7);
                while( true ) {
                  uVar23 = (ulong)((((uint)uVar24 & uVar7) >> (bVar1 & 0x1f)) + (uint)uVar3);
                  bVar2 = *(byte *)((long)pPVar21 + uVar23 * 4 + 1);
                  if ((uint)bVar2 + (uint)bVar1 <= uVar19) break;
                  if (uVar6 == 0) {
                    uVar6 = (*local_a0)(local_80,&next);
                    if (uVar6 == 0) goto LAB_00150df8;
                    pPVar21 = piVar27->prev;
                    uVar7 = (uint)local_60;
                  }
                  uVar6 = uVar6 - 1;
                  uVar24 = uVar24 + ((ulong)*next << ((byte)uVar19 & 0x3f));
                  uVar19 = uVar19 + 8;
                  next = next + 1;
                }
                uVar24 = uVar24 >> (bVar1 & 0x3f);
                uVar3 = pPVar21[uVar23 * 2 + 1];
                bVar20 = (byte)pPVar21[uVar23 * 2];
                uVar19 = (ulong)((int)uVar19 - (uint)bVar1);
              }
              uVar14 = (uint)uVar3;
              uVar7 = (int)uVar19 - (uint)bVar2;
              uVar19 = (ulong)uVar7;
              uVar24 = uVar24 >> (bVar2 & 0x3f);
              if ((bVar20 & 0x40) == 0) {
                *(uint *)&piVar27->window = uVar14;
                uVar15 = bVar20 & 0xf;
                *(uint *)((long)&piVar27->window + 4) = uVar15;
                if ((bVar20 & 0xf) != 0) {
                  while( true ) {
                    uVar14 = (uint)uVar19;
                    uVar7 = uVar14 - uVar15;
                    if (uVar15 <= uVar14) break;
                    if (uVar6 == 0) {
                      uVar6 = (*local_a0)(local_80,&next);
                      if (uVar6 == 0) goto LAB_00150df8;
                      uVar15 = *(uint *)((long)&piVar27->window + 4);
                    }
                    uVar6 = uVar6 - 1;
                    uVar24 = uVar24 + ((ulong)*next << ((byte)uVar19 & 0x3f));
                    uVar19 = (ulong)(uVar14 + 8);
                    next = next + 1;
                  }
                  uVar14 = (~(-1 << ((byte)uVar15 & 0x1f)) & (uint)uVar24) +
                           *(int *)&piVar27->window;
                  *(uint *)&piVar27->window = uVar14;
                  uVar24 = uVar24 >> ((byte)uVar15 & 0x3f);
                }
                uVar19 = (ulong)uVar7;
                uVar7 = *(uint *)((long)&piVar27->gzhead + 4);
                uVar15 = 0;
                if ((uint)piVar27->gzindex < uVar7) {
                  uVar15 = local_ac;
                }
                uVar18 = local_ac;
                if (uVar7 - uVar15 < uVar14) {
                  local_98->msg = "invalid distance too far back";
                  piVar27->status = 0x3f51;
                  uVar7 = local_ac;
                }
                else {
                  do {
                    uVar7 = *(uint *)((long)&piVar27->gzhead + 4);
                    if (uVar18 == 0) {
                      local_88 = *(uchar **)&piVar27->method;
                      *(uint *)&piVar27->gzindex = uVar7;
                      iVar8 = (*local_a8)(local_68,local_88,uVar7);
                      if (iVar8 != 0) {
                        bVar28 = false;
                        p_Var25 = local_a8;
                        goto LAB_00150e0c;
                      }
                      uVar18 = uVar7;
                      uVar7 = *(uint *)((long)&piVar27->gzhead + 4);
                    }
                    uVar7 = uVar7 - *(uint *)&piVar27->window;
                    uVar23 = (ulong)uVar7;
                    bVar28 = uVar18 <= uVar7;
                    if (bVar28) {
                      uVar7 = 0;
                    }
                    uVar14 = *(uint *)&piVar27->field_0x5c;
                    if (bVar28) {
                      uVar23 = -(ulong)*(uint *)&piVar27->window;
                    }
                    uVar15 = uVar18 - uVar7;
                    if (uVar14 <= uVar18 - uVar7) {
                      uVar15 = uVar14;
                    }
                    *(uint *)&piVar27->field_0x5c = uVar14 - uVar15;
                    uVar7 = uVar15;
                    do {
                      *local_88 = local_88[uVar23];
                      local_88 = local_88 + 1;
                      uVar7 = uVar7 - 1;
                    } while (uVar7 != 0);
                    uVar7 = uVar18 - uVar15;
                    uVar18 = uVar18 - uVar15;
                  } while (*(int *)&piVar27->field_0x5c != 0);
                }
                break;
              }
              pcVar10 = "invalid distance code";
              pzVar26 = local_98;
            }
            else {
              pcVar10 = "invalid literal/length code";
              pzVar26 = local_98;
            }
            goto LAB_001503fd;
          }
          piVar27->status = 0x3f3f;
          uVar7 = local_ac;
        }
      }
      else {
        local_98->next_out = local_88;
        local_98->avail_out = local_ac;
        local_98->next_in = next;
        local_98->avail_in = uVar6;
        piVar27->w_size = (int)uVar24;
        piVar27->w_bits = (int)(uVar24 >> 0x20);
        piVar27->w_mask = (uInt)uVar19;
        uVar6 = *(uint *)((long)&piVar27->gzhead + 4);
        if ((uint)piVar27->gzindex < uVar6) {
          *(uint *)&piVar27->gzindex = uVar6 - local_ac;
        }
        inflate_fast(local_98,uVar6);
        next = pzVar26->next_in;
        local_88 = pzVar26->next_out;
        uVar6 = pzVar26->avail_in;
        uVar24._0_4_ = piVar27->w_size;
        uVar24._4_4_ = piVar27->w_bits;
        uVar19 = (ulong)piVar27->w_mask;
        uVar7 = pzVar26->avail_out;
      }
      break;
    default:
      p_Var25 = local_a8;
      if (iVar8 == 0x3f50) {
        bVar28 = true;
        local_8c = 1;
      }
      else if (iVar8 == 0x3f51) {
        local_8c = -3;
LAB_00150e82:
        bVar28 = false;
      }
      else {
        local_8c = -2;
      }
      goto LAB_00150e0c;
    }
    local_ac = uVar7;
    iVar8 = piVar27->status;
  } while( true );
LAB_00150df8:
  next = (uchar *)0x0;
  uVar6 = 0;
  goto LAB_00150e03;
}

Assistant:

int ZEXPORT inflateBack(z_streamp strm, in_func in, void FAR *in_desc,
                        out_func out, void FAR *out_desc) {
    struct inflate_state FAR *state;
    z_const unsigned char FAR *next;    /* next input */
    unsigned char FAR *put;     /* next output */
    unsigned have, left;        /* available input and output */
    unsigned long hold;         /* bit buffer */
    unsigned bits;              /* bits in bit buffer */
    unsigned copy;              /* number of stored or match bytes to copy */
    unsigned char FAR *from;    /* where to copy match bytes from */
    code here;                  /* current decoding table entry */
    code last;                  /* parent table entry */
    unsigned len;               /* length to copy for repeats, bits to drop */
    int ret;                    /* return code */
    static const unsigned short order[19] = /* permutation of code lengths */
        {16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15};

    /* Check that the strm exists and that the state was initialized */
    if (strm == Z_NULL || strm->state == Z_NULL)
        return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;

    /* Reset the state */
    strm->msg = Z_NULL;
    state->mode = TYPE;
    state->last = 0;
    state->whave = 0;
    next = strm->next_in;
    have = next != Z_NULL ? strm->avail_in : 0;
    hold = 0;
    bits = 0;
    put = state->window;
    left = state->wsize;

    /* Inflate until end of block marked as last */
    for (;;)
        switch (state->mode) {
        case TYPE:
            /* determine and dispatch block type */
            if (state->last) {
                BYTEBITS();
                state->mode = DONE;
                break;
            }
            NEEDBITS(3);
            state->last = BITS(1);
            DROPBITS(1);
            switch (BITS(2)) {
            case 0:                             /* stored block */
                Tracev((stderr, "inflate:     stored block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = STORED;
                break;
            case 1:                             /* fixed block */
                fixedtables(state);
                Tracev((stderr, "inflate:     fixed codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = LEN;              /* decode codes */
                break;
            case 2:                             /* dynamic block */
                Tracev((stderr, "inflate:     dynamic codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = TABLE;
                break;
            case 3:
                strm->msg = (char *)"invalid block type";
                state->mode = BAD;
            }
            DROPBITS(2);
            break;

        case STORED:
            /* get and verify stored block length */
            BYTEBITS();                         /* go to byte boundary */
            NEEDBITS(32);
            if ((hold & 0xffff) != ((hold >> 16) ^ 0xffff)) {
                strm->msg = (char *)"invalid stored block lengths";
                state->mode = BAD;
                break;
            }
            state->length = (unsigned)hold & 0xffff;
            Tracev((stderr, "inflate:       stored length %u\n",
                    state->length));
            INITBITS();

            /* copy stored block from input to output */
            while (state->length != 0) {
                copy = state->length;
                PULL();
                ROOM();
                if (copy > have) copy = have;
                if (copy > left) copy = left;
                zmemcpy(put, next, copy);
                have -= copy;
                next += copy;
                left -= copy;
                put += copy;
                state->length -= copy;
            }
            Tracev((stderr, "inflate:       stored end\n"));
            state->mode = TYPE;
            break;

        case TABLE:
            /* get dynamic table entries descriptor */
            NEEDBITS(14);
            state->nlen = BITS(5) + 257;
            DROPBITS(5);
            state->ndist = BITS(5) + 1;
            DROPBITS(5);
            state->ncode = BITS(4) + 4;
            DROPBITS(4);
#ifndef PKZIP_BUG_WORKAROUND
            if (state->nlen > 286 || state->ndist > 30) {
                strm->msg = (char *)"too many length or distance symbols";
                state->mode = BAD;
                break;
            }
#endif
            Tracev((stderr, "inflate:       table sizes ok\n"));

            /* get code length code lengths (not a typo) */
            state->have = 0;
            while (state->have < state->ncode) {
                NEEDBITS(3);
                state->lens[order[state->have++]] = (unsigned short)BITS(3);
                DROPBITS(3);
            }
            while (state->have < 19)
                state->lens[order[state->have++]] = 0;
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 7;
            ret = inflate_table(CODES, state->lens, 19, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid code lengths set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       code lengths ok\n"));

            /* get length and distance code code lengths */
            state->have = 0;
            while (state->have < state->nlen + state->ndist) {
                for (;;) {
                    here = state->lencode[BITS(state->lenbits)];
                    if ((unsigned)(here.bits) <= bits) break;
                    PULLBYTE();
                }
                if (here.val < 16) {
                    DROPBITS(here.bits);
                    state->lens[state->have++] = here.val;
                }
                else {
                    if (here.val == 16) {
                        NEEDBITS(here.bits + 2);
                        DROPBITS(here.bits);
                        if (state->have == 0) {
                            strm->msg = (char *)"invalid bit length repeat";
                            state->mode = BAD;
                            break;
                        }
                        len = (unsigned)(state->lens[state->have - 1]);
                        copy = 3 + BITS(2);
                        DROPBITS(2);
                    }
                    else if (here.val == 17) {
                        NEEDBITS(here.bits + 3);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 3 + BITS(3);
                        DROPBITS(3);
                    }
                    else {
                        NEEDBITS(here.bits + 7);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 11 + BITS(7);
                        DROPBITS(7);
                    }
                    if (state->have + copy > state->nlen + state->ndist) {
                        strm->msg = (char *)"invalid bit length repeat";
                        state->mode = BAD;
                        break;
                    }
                    while (copy--)
                        state->lens[state->have++] = (unsigned short)len;
                }
            }

            /* handle error breaks in while */
            if (state->mode == BAD) break;

            /* check for end-of-block code (better have one) */
            if (state->lens[256] == 0) {
                strm->msg = (char *)"invalid code -- missing end-of-block";
                state->mode = BAD;
                break;
            }

            /* build code tables -- note: do not change the lenbits or distbits
               values here (9 and 6) without reading the comments in inftrees.h
               concerning the ENOUGH constants, which depend on those values */
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 9;
            ret = inflate_table(LENS, state->lens, state->nlen, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid literal/lengths set";
                state->mode = BAD;
                break;
            }
            state->distcode = (code const FAR *)(state->next);
            state->distbits = 6;
            ret = inflate_table(DISTS, state->lens + state->nlen, state->ndist,
                            &(state->next), &(state->distbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid distances set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       codes ok\n"));
            state->mode = LEN;
                /* fallthrough */

        case LEN:
            /* use inflate_fast() if we have enough input and output */
            if (have >= 6 && left >= 258) {
                RESTORE();
                if (state->whave < state->wsize)
                    state->whave = state->wsize - left;
                inflate_fast(strm, state->wsize);
                LOAD();
                break;
            }

            /* get a literal, length, or end-of-block code */
            for (;;) {
                here = state->lencode[BITS(state->lenbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if (here.op && (here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->lencode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            state->length = (unsigned)here.val;

            /* process literal */
            if (here.op == 0) {
                Tracevv((stderr, here.val >= 0x20 && here.val < 0x7f ?
                        "inflate:         literal '%c'\n" :
                        "inflate:         literal 0x%02x\n", here.val));
                ROOM();
                *put++ = (unsigned char)(state->length);
                left--;
                state->mode = LEN;
                break;
            }

            /* process end of block */
            if (here.op & 32) {
                Tracevv((stderr, "inflate:         end of block\n"));
                state->mode = TYPE;
                break;
            }

            /* invalid code */
            if (here.op & 64) {
                strm->msg = (char *)"invalid literal/length code";
                state->mode = BAD;
                break;
            }

            /* length code -- get extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->length += BITS(state->extra);
                DROPBITS(state->extra);
            }
            Tracevv((stderr, "inflate:         length %u\n", state->length));

            /* get distance code */
            for (;;) {
                here = state->distcode[BITS(state->distbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if ((here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->distcode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            if (here.op & 64) {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
            state->offset = (unsigned)here.val;

            /* get distance extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->offset += BITS(state->extra);
                DROPBITS(state->extra);
            }
            if (state->offset > state->wsize - (state->whave < state->wsize ?
                                                left : 0)) {
                strm->msg = (char *)"invalid distance too far back";
                state->mode = BAD;
                break;
            }
            Tracevv((stderr, "inflate:         distance %u\n", state->offset));

            /* copy match from window to output */
            do {
                ROOM();
                copy = state->wsize - state->offset;
                if (copy < left) {
                    from = put + copy;
                    copy = left - copy;
                }
                else {
                    from = put - state->offset;
                    copy = left;
                }
                if (copy > state->length) copy = state->length;
                state->length -= copy;
                left -= copy;
                do {
                    *put++ = *from++;
                } while (--copy);
            } while (state->length != 0);
            break;

        case DONE:
            /* inflate stream terminated properly */
            ret = Z_STREAM_END;
            goto inf_leave;

        case BAD:
            ret = Z_DATA_ERROR;
            goto inf_leave;

        default:
            /* can't happen, but makes compilers happy */
            ret = Z_STREAM_ERROR;
            goto inf_leave;
        }

    /* Write leftover output and return unused input */
  inf_leave:
    if (left < state->wsize) {
        if (out(out_desc, state->window, state->wsize - left) &&
            ret == Z_STREAM_END)
            ret = Z_BUF_ERROR;
    }
    strm->next_in = next;
    strm->avail_in = have;
    return ret;
}